

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainer.cpp
# Opt level: O2

void __thiscall
chrono::ChProximityContainer::ArchiveOUT(ChProximityContainer *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite(marchive,1);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  return;
}

Assistant:

void ChProximityContainer::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite(1);
    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);
    // serialize all member data:
}